

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadArray<unsigned_int>
          (CrateReader *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *d)

{
  StreamReader *this_00;
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  void *__buf;
  uint *__nbytes;
  ssize_t sVar4;
  string local_830;
  ostringstream local_810 [8];
  ostringstream ss_e_4;
  string local_698;
  ostringstream local_678 [8];
  ostringstream ss_e_3;
  string local_500;
  ostringstream local_4e0 [8];
  ostringstream ss_e_2;
  string local_368;
  ostringstream local_348 [8];
  ostringstream ss_e_1;
  uint local_1cc;
  undefined1 local_1c8 [4];
  uint32_t _n;
  ostringstream local_1a8 [8];
  ostringstream ss_e;
  uint32_t local_2c;
  ulong uStack_28;
  uint32_t shapesize;
  uint64_t n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *d_local;
  CrateReader *this_local;
  
  if (d == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_00293cc4;
  }
  uStack_28 = 0;
  n = (uint64_t)d;
  d_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  if ((this->_version[0] == '\0') && (this->_version[1] < 7)) {
    bVar1 = StreamReader::read4(this->_sr,&local_2c);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x63a);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_1a8,"Failed to read the number of array elements."
                                );
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)local_1c8);
      ::std::__cxx11::string::~string((string *)local_1c8);
      ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
      this_local._7_1_ = 0;
      goto LAB_00293cc4;
    }
    bVar1 = StreamReader::read4(this->_sr,&local_1cc);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_348);
      poVar2 = ::std::operator<<((ostream *)local_348,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x63f);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_348,"Failed to read the number of array elements."
                                );
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_368);
      ::std::__cxx11::string::~string((string *)&local_368);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_348);
      goto LAB_00293cc4;
    }
    uStack_28 = (ulong)local_1cc;
  }
  else {
    bVar1 = StreamReader::read8(this->_sr,&stack0xffffffffffffffd8);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_4e0);
      poVar2 = ::std::operator<<((ostream *)local_4e0,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x644);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_4e0,"Failed to read the number of array elements."
                                );
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_500);
      ::std::__cxx11::string::~string((string *)&local_500);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_4e0);
      goto LAB_00293cc4;
    }
  }
  if ((this->_config).maxArrayElements < uStack_28) {
    ::std::__cxx11::ostringstream::ostringstream(local_678);
    poVar2 = ::std::operator<<((ostream *)local_678,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadArray");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x64a);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_678,"Too many array elements.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_698);
    ::std::__cxx11::string::~string((string *)&local_698);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_678);
  }
  else if (uStack_28 == 0) {
    this_local._7_1_ = 1;
  }
  else {
    this->_memoryUsage = uStack_28 * 4 + this->_memoryUsage;
    if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
      ::std::__cxx11::ostringstream::ostringstream(local_810);
      poVar2 = ::std::operator<<((ostream *)local_810,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadArray");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x651);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_810,"Reached to max memory budget.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_830);
      ::std::__cxx11::string::~string((string *)&local_830);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_810);
    }
    else {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)n,uStack_28);
      this_00 = this->_sr;
      lVar3 = uStack_28 << 2;
      __buf = (void *)(uStack_28 << 2);
      __nbytes = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)n);
      sVar4 = StreamReader::read(this_00,(int)lVar3,__buf,(size_t)__nbytes);
      if (sVar4 == 0) {
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
LAB_00293cc4:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadArray(std::vector<T> *d) {

  if (!d) {
    return false;
  }

  uint64_t n{0};
  if (VERSION_LESS_THAN_0_8_0(_version)) {
    uint32_t shapesize; // not used
    if (!_sr->read4(&shapesize)) {
      PUSH_ERROR("Failed to read the number of array elements.");
      return false;
    }
    uint32_t _n;
    if (!_sr->read4(&_n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
    }
    n = _n;
  } else {
    if (!_sr->read8(&n)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of array elements.");
      return false;
    }
  }

  if (n > _config.maxArrayElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many array elements.");
  }

  if (n == 0) {
    return true;
  }

  CHECK_MEMORY_USAGE(sizeof(T) * size_t(n));

  d->resize(size_t(n));
  if (_sr->read(sizeof(T) * n, sizeof(T) * size_t(n), reinterpret_cast<uint8_t *>(d->data()))) {
    return false;
  }

  return true;
}